

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::GatherTesselationShader::Run(GatherTesselationShader *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  uint uVar9;
  GLuint GVar10;
  char *src_vs;
  char *src_tcs;
  char *src_tes;
  char *src_fs;
  float *pfVar11;
  CallLogWrapper *this_00;
  Vector<float,_4> local_f8;
  undefined1 local_e8 [8];
  Vec4 data;
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  undefined1 local_48 [8];
  Vec4 buffData;
  GLfloat colorf [4];
  GLenum local_1c;
  GatherTesselationShader *pGStack_18;
  GLenum drawBuffer;
  GatherTesselationShader *this_local;
  
  pGStack_18 = this;
  uVar9 = (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
            [0x24])();
  if ((uVar9 & 1) == 0) {
    this_local = (GatherTesselationShader *)0x0;
  }
  else {
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])
              ();
    this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&(this->super_GatherBase).rbo);
    glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,(this->super_GatherBase).rbo);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])
              ();
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (this_00,0x8d40,0x8ce0,0x8d41,(this->super_GatherBase).rbo);
    local_1c = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers(this_00,1,&local_1c);
    buffData.m_data[2] = 0.0;
    buffData.m_data[3] = 0.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,buffData.m_data + 2);
    glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&(this->super_GatherBase).vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,(this->super_GatherBase).vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])
              ();
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,local_48,0x88e4);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1a])
              ();
    src_vs = (char *)std::__cxx11::string::c_str();
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x27])
              (local_88);
    src_tcs = (char *)std::__cxx11::string::c_str();
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x28])
              (local_b8);
    src_tes = (char *)std::__cxx11::string::c_str();
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
              (data.m_data + 2);
    src_fs = (char *)std::__cxx11::string::c_str();
    GVar10 = TGBase::CreateProgram((TGBase *)this,src_vs,src_tcs,src_tes,(char *)0x0,src_fs);
    (this->super_GatherBase).program = GVar10;
    std::__cxx11::string::~string((string *)(data.m_data + 2));
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    glu::CallLogWrapper::glBindAttribLocation
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(this->super_GatherBase).program,0,"v_in_0");
    glu::CallLogWrapper::glBindFragDataLocation
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(this->super_GatherBase).program,0,"f_out_0");
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,(this->super_GatherBase).program);
    bVar8 = TGBase::CheckProgram((TGBase *)this,(this->super_GatherBase).program,(bool *)0x0);
    if (bVar8) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(this->super_GatherBase).program);
      glu::CallLogWrapper::glPatchParameteri
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xe,0,1);
      glu::CallLogWrapper::glReadBuffer
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8ce0);
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(this->super_GatherBase).program);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e8);
      glu::CallLogWrapper::glReadPixels
                (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1,1,0x1908,0x1406,local_e8);
      tcu::Vector<float,_4>::Vector(&local_f8,0.0,1.0,0.0,1.0);
      bVar8 = TGBase::ColorEqual((TGBase *)this,(Vec4 *)local_e8,&local_f8,
                                 &(this->super_GatherBase).super_TGBase.g_color_eps);
      if (((bVar8 ^ 0xffU) & 1) == 0) {
        this_local = (GatherTesselationShader *)0x0;
      }
      else {
        pfVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_e8);
        fVar1 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_e8);
        fVar2 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_e8);
        fVar3 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_e8);
        fVar4 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::x(&(this->super_GatherBase).super_TGBase.g_color_eps);
        fVar5 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::y(&(this->super_GatherBase).super_TGBase.g_color_eps);
        fVar6 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::z(&(this->super_GatherBase).super_TGBase.g_color_eps);
        fVar7 = *pfVar11;
        pfVar11 = tcu::Vector<float,_4>::w(&(this->super_GatherBase).super_TGBase.g_color_eps);
        anon_unknown_0::Output
                  ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",
                   SUB84((double)fVar1,0),(double)fVar2,(double)fVar3,(double)fVar4,(double)fVar5,
                   (double)fVar6,(double)fVar7,(double)*pfVar11);
        this_local = (GatherTesselationShader *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (GatherTesselationShader *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		SetRbo();
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		program = CreateProgram(VertexShader().c_str(), ControlShader().c_str(), EvalShader().c_str(), NULL,
								FragmentShader().c_str());
		glBindAttribLocation(program, 0, "v_in_0");
		glBindFragDataLocation(program, 0, "f_out_0");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glReadBuffer(GL_COLOR_ATTACHMENT0);

		glDeleteProgram(program);
		Vec4 data;
		glReadPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, &data);
		if (!ColorEqual(data, Vec4(0, 1, 0, 1), g_color_eps))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", data.x(), data.y(),
				   data.z(), data.w(), g_color_eps.x(), g_color_eps.y(), g_color_eps.z(), g_color_eps.w());
			return ERROR;
		}
		return NO_ERROR;
	}